

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_asr_r_8(m68k_info *info)

{
  build_r(info,10,'\x01');
  return;
}

Assistant:

static void d68000_asr_r_8(m68k_info *info)
{
	build_r(info, M68K_INS_ASR, 1);
}